

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O3

void aom_noise_model_save_latest(aom_noise_model_t *noise_model)

{
  size_t sVar1;
  undefined4 uVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = -0x150;
  do {
    lVar3 = (long)*(int *)((long)&noise_model->latest_state[0].eqns.n + lVar4);
    sVar1 = lVar3 * 8;
    memcpy(*(void **)((long)&noise_model->latest_state[0].eqns.A + lVar4),
           *(void **)((long)&noise_model->coords + lVar4),lVar3 * sVar1);
    memcpy(*(void **)((long)&noise_model->latest_state[0].eqns.x + lVar4),
           *(void **)((long)noise_model[1].combined_state + lVar4 + -0x10),sVar1);
    memcpy(*(void **)((long)&noise_model->latest_state[0].eqns.b + lVar4),
           *(void **)((long)&noise_model->n + lVar4),sVar1);
    lVar3 = (long)*(int *)((long)&noise_model->latest_state[0].strength_solver.eqns.n + lVar4);
    sVar1 = lVar3 * 8;
    memcpy(*(void **)((long)&noise_model->latest_state[0].strength_solver.eqns.A + lVar4),
           *(void **)((long)&noise_model[1].combined_state[0].eqns.A + lVar4),lVar3 * sVar1);
    memcpy(*(void **)((long)&noise_model->latest_state[0].strength_solver.eqns.x + lVar4),
           *(void **)((long)&noise_model[1].combined_state[0].eqns.x + lVar4),sVar1);
    memcpy(*(void **)((long)&noise_model->latest_state[0].strength_solver.eqns.b + lVar4),
           *(void **)((long)&noise_model[1].combined_state[0].eqns.b + lVar4),sVar1);
    uVar2 = *(undefined4 *)
             ((long)&noise_model[1].combined_state[0].strength_solver.min_intensity + lVar4);
    *(undefined4 *)((long)&noise_model->latest_state[0].strength_solver.num_equations + lVar4) =
         *(undefined4 *)((long)&noise_model[1].combined_state[0].strength_solver.eqns.x + lVar4 + 4)
    ;
    *(undefined4 *)((long)&noise_model->latest_state[0].num_observations + lVar4) = uVar2;
    *(undefined8 *)((long)&noise_model->latest_state[0].ar_gain + lVar4) =
         *(undefined8 *)
          ((long)&noise_model[1].combined_state[0].strength_solver.max_intensity + lVar4);
    lVar4 = lVar4 + 0x70;
  } while (lVar4 != 0);
  return;
}

Assistant:

void aom_noise_model_save_latest(aom_noise_model_t *noise_model) {
  for (int c = 0; c < 3; c++) {
    equation_system_copy(&noise_model->combined_state[c].eqns,
                         &noise_model->latest_state[c].eqns);
    equation_system_copy(&noise_model->combined_state[c].strength_solver.eqns,
                         &noise_model->latest_state[c].strength_solver.eqns);
    noise_model->combined_state[c].strength_solver.num_equations =
        noise_model->latest_state[c].strength_solver.num_equations;
    noise_model->combined_state[c].num_observations =
        noise_model->latest_state[c].num_observations;
    noise_model->combined_state[c].ar_gain =
        noise_model->latest_state[c].ar_gain;
  }
}